

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.t.cpp
# Opt level: O1

Signal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_int> * __thiscall
dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::operator=
          (Signal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_int> *this,
          Matrix<double,__1,__1,_0,__1,__1> *t)

{
  assign_op<double,_double> local_12;
  assign_op<double,_double> local_11;
  
  if (((this->keepReference == true) && (this->signalType == REFERENCE_NON_CONST)) &&
     (this->TreferenceNonConst != (Matrix<double,__1,__1,_0,__1,__1> *)0x0)) {
    if (this->providerMutex == (Mutex *)0x0) {
      setTcopy(this,t);
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                (this->TreferenceNonConst,t,&local_12);
    }
    else {
      setTcopy(this,t);
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                (this->TreferenceNonConst,t,&local_11);
    }
  }
  else {
    (*(this->super_SignalBase<int>)._vptr_SignalBase[0x18])(this,t);
  }
  return this;
}

Assistant:

Signal<T, Time> &Signal<T, Time>::operator=(const T &t) {
  if (keepReference && (REFERENCE_NON_CONST == signalType) &&
      (NULL != TreferenceNonConst)) {
    if (NULL == providerMutex) {
      setTcopy(t);
      (*TreferenceNonConst) = t;
    } else {
      try {
#ifdef HAVE_LIBBOOST_THREAD
        boost::try_mutex::scoped_try_lock lock(*providerMutex);
#endif
        setTcopy(t);
        (*TreferenceNonConst) = t;
      } catch (const MutexError &) { /* TODO ERROR */
      }
    }
  } else {
    setConstant(t);
  }
  return *this;
}